

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

Expression *
slang::ast::ConcatenationExpression::fromEmpty
          (Compilation *compilation,EmptyQueueExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  bool bVar1;
  int iVar2;
  Expression *pEVar3;
  Diagnostic *pDVar4;
  ConstantRange CVar5;
  ConcatenationExpression *pCVar6;
  int iVar7;
  DiagCode code;
  SourceRange SVar8;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_48;
  SourceRange local_30;
  
  if (assignmentTarget != (Type *)0x0) {
    bVar1 = Type::isUnpackedArray(assignmentTarget);
    if (bVar1) {
      if (assignmentTarget->canonical == (Type *)0x0) {
        Type::resolveCanonical(assignmentTarget);
      }
      if ((assignmentTarget->canonical->super_Symbol).kind != AssociativeArrayType) {
        bVar1 = Type::hasFixedRange(assignmentTarget);
        if (bVar1) {
          SVar8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
          pDVar4 = ASTContext::addDiag(context,(DiagCode)0x940007,SVar8);
          pDVar4 = ast::operator<<(pDVar4,assignmentTarget);
          CVar5 = Type::getFixedRange(assignmentTarget);
          iVar2 = CVar5.left - CVar5.right;
          iVar7 = -iVar2;
          if (0 < iVar2) {
            iVar7 = iVar2;
          }
          local_48.data_ = (pointer)(ulong)(iVar7 + 1);
          std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
          ::emplace_back<unsigned_long>(&pDVar4->args,(unsigned_long *)&local_48);
          local_48.data_ = (pointer)0x0;
          std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
          ::emplace_back<long>(&pDVar4->args,(long *)&local_48);
          pCVar6 = (ConcatenationExpression *)Expression::badExpr(compilation,(Expression *)0x0);
        }
        else {
          local_48.data_ = (pointer)0x0;
          local_48.size_ = 0;
          local_30 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
          pCVar6 = BumpAllocator::
                   emplace<slang::ast::ConcatenationExpression,slang::ast::Type_const&,nonstd::span_lite::span<slang::ast::Expression_const*const,18446744073709551615ul>,slang::SourceRange>
                             (&compilation->super_BumpAllocator,assignmentTarget,&local_48,&local_30
                             );
        }
        return &pCVar6->super_Expression;
      }
      SVar8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      code.subsystem = Expressions;
      code.code = 0x93;
      goto LAB_003aeb3a;
    }
  }
  SVar8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  code.subsystem = Expressions;
  code.code = 0x44;
LAB_003aeb3a:
  ASTContext::addDiag(context,code,SVar8);
  pEVar3 = Expression::badExpr(compilation,(Expression *)0x0);
  return pEVar3;
}

Assistant:

Expression& ConcatenationExpression::fromEmpty(Compilation& compilation,
                                               const EmptyQueueExpressionSyntax& syntax,
                                               const ASTContext& context,
                                               const Type* assignmentTarget) {
    // Empty concatenation can only target arrays.
    if (!assignmentTarget || !assignmentTarget->isUnpackedArray()) {
        context.addDiag(diag::EmptyConcatNotAllowed, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    if (assignmentTarget->isAssociativeArray()) {
        context.addDiag(diag::UnpackedConcatAssociative, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    if (assignmentTarget->hasFixedRange()) {
        context.addDiag(diag::UnpackedConcatSize, syntax.sourceRange())
            << *assignmentTarget << assignmentTarget->getFixedRange().width() << 0;
        return badExpr(compilation, nullptr);
    }

    return *compilation.emplace<ConcatenationExpression>(*assignmentTarget,
                                                         span<const Expression* const>{},
                                                         syntax.sourceRange());
}